

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  int *piVar5;
  Layer *pLVar6;
  _func_int **pp_Var7;
  void *pvVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  uint _w;
  int iVar28;
  size_type sVar29;
  int iVar30;
  size_t _elemsize;
  Option *opt_00;
  long lVar31;
  uint _elempack;
  ulong uVar32;
  ulong uVar33;
  void *pvVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  int local_258;
  ulong local_240;
  ulong local_218;
  Mat local_208;
  Mat local_1b8;
  ulong local_170;
  Mat local_168;
  int local_11c;
  void *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  int local_100;
  Allocator *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  ulong local_d8;
  _func_int ***local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  int local_b8;
  int iStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  ulong local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) != 0)) {
    iVar22 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar22;
  }
  uVar25 = bottom_blob->c;
  uVar33 = bottom_blob->elemsize;
  iVar22 = bottom_blob->elempack;
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var4);
  iVar2 = *(int *)(&this->field_0xd8 + (long)p_Var4);
  iVar3 = *(int *)(&this->field_0xdc + (long)p_Var4);
  iVar26 = *(int *)(&this->field_0xe0 + (long)p_Var4);
  local_208.cstep = 0;
  local_208.data = (Allocator *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elempack = 0;
  local_208.elemsize._4_4_ = (int)local_208.refcount;
  local_208.allocator = (Allocator *)local_208.data;
  local_208.dims = (int)local_208.refcount;
  local_208.w = local_208.refcount._4_4_;
  local_208.h = (int)local_208.elemsize;
  local_208.d = (int)local_208.refcount;
  local_208.c = local_208.elempack;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_fma +
             (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]),bottom_blob,&local_208,opt);
  iVar21 = local_208.w;
  iVar28 = -100;
  if (((Allocator *)local_208.data == (Allocator *)0x0) ||
     ((long)local_208.c * local_208.cstep == 0)) goto LAB_0040c257;
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  uVar32 = (long)(~((iVar27 + -1) * iVar3) + local_208.w) /
           (long)*(int *)(&this->field_0xe4 + (long)p_Var4);
  local_170 = uVar32 & 0xffffffff;
  _w = (int)uVar32 + 1;
  iVar27 = (~((iVar2 + -1) * iVar26) + local_208.h) / *(int *)(&this->field_0xe8 + (long)p_Var4);
  uVar32 = 1;
  if (opt->use_packing_layout == true) {
    uVar32 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var4) & 7) != 0) {
      uVar32 = (ulong)((*(uint *)(&this->field_0xd0 + (long)p_Var4) & 3) == 0) * 3 + 1;
    }
  }
  _elempack = (uint)uVar32;
  _elemsize = (uVar33 / (ulong)(long)iVar22) * uVar32;
  Mat::create(top_blob,_w,iVar27 + 1,*(int *)(&this->field_0xd0 + (long)p_Var4) / (int)_elempack,
              _elemsize,_elempack,opt->blob_allocator);
  iVar28 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0040c257;
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86_fma[-3];
  uVar24 = *(uint *)(&this->field_0x108 + (long)p_Var4);
  opt_00 = (Option *)(ulong)uVar24;
  if ((iVar22 * uVar25 != uVar24) || (uVar24 != *(uint *)(&this->field_0xd0 + (long)p_Var4))) {
LAB_0040b064:
    uVar23 = (int)(iVar22 * uVar25) / (int)uVar24;
    uVar24 = *(int *)(&this->field_0xd0 + (long)p_Var4) / (int)uVar24;
    local_258 = 1;
    uVar25 = 1;
    if (opt->use_packing_layout == true) {
      local_258 = (uint)((uVar23 & 3) == 0) * 3 + 1;
      if ((uVar23 & 7) == 0) {
        local_258 = 8;
      }
      uVar25 = (uint)((uVar24 & 3) == 0) * 3 + 1;
      if ((uVar24 & 7) == 0) {
        uVar25 = 8;
      }
    }
    piVar5 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
    local_168.data = local_208.data;
    local_168.refcount._0_4_ = (int)local_208.refcount;
    local_168.refcount._4_4_ = local_208.refcount._4_4_;
    local_168.elemsize._0_4_ = (int)local_208.elemsize;
    local_168.elemsize._4_4_ = local_208.elemsize._4_4_;
    local_168.elempack = local_208.elempack;
    local_168.allocator = local_208.allocator;
    local_168.w = local_208.w;
    local_168.dims = local_208.dims;
    local_168.d = local_208.d;
    local_168.h = local_208.h;
    local_168.c = local_208.c;
    local_168.cstep = local_208.cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    if (local_258 < iVar22) {
      local_1b8.data = *(void **)opt;
      uVar13 = opt->openmp_blocktime;
      uVar14 = opt->use_winograd_convolution;
      uVar16 = opt->use_sgemm_convolution;
      uVar18 = opt->use_int8_inference;
      uVar20 = opt->use_vulkan_compute;
      uVar19 = CONCAT11(uVar20,uVar18);
      uVar17 = CONCAT21(uVar19,uVar16);
      uVar15 = CONCAT31(uVar17,uVar14);
      local_1b8.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_1b8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      local_1b8._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_1b8.c._0_1_ = opt->use_winograd43_convolution;
      local_1b8.c._1_1_ = opt->use_winograd63_convolution;
      local_1b8.c._2_1_ = opt->use_a53_a55_optimized_kernel;
      local_1b8.c._3_1_ = opt->use_reserved_7;
      local_1b8._60_1_ = opt->use_reserved_8;
      local_1b8._61_1_ = opt->use_reserved_9;
      local_1b8._62_1_ = opt->use_reserved_10;
      local_1b8._63_1_ = opt->use_reserved_11;
      local_1b8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      local_1b8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_1b8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      local_1b8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_1b8.elempack = uVar13;
      local_1b8._28_4_ = uVar15;
      convert_packing(&local_208,&local_168,local_258,(Option *)&local_1b8);
    }
    piVar5 = top_blob->refcount;
    local_1b8.data = top_blob->data;
    local_1b8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1b8.elemsize._0_4_ = (undefined4)top_blob->elemsize;
    local_1b8.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
    local_1b8.elempack = top_blob->elempack;
    local_1b8.allocator = top_blob->allocator;
    local_1b8.dims = top_blob->dims;
    local_1b8.w = top_blob->w;
    local_1b8.h = top_blob->h;
    local_1b8.d = top_blob->d;
    local_1b8.c = top_blob->c;
    local_1b8.cstep = top_blob->cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    if (uVar25 < _elempack) {
      Mat::create(&local_1b8,_w,iVar27 + 1,
                  *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]) /
                  (int)uVar25,(ulong)uVar25 * (_elemsize / uVar32),uVar25,opt->workspace_allocator);
      iVar28 = -100;
      if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0))
      goto LAB_0040b281;
    }
    else {
LAB_0040b281:
      if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3])) {
        local_170 = CONCAT44(local_170._4_4_,(int)uVar23 / local_258);
        iVar27 = 0;
        iVar22 = 0;
        lVar31 = 0;
        do {
          local_88 = CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize);
          local_c8 = (_func_int ***)
                     ((long)(_func_int ***)local_168.data +
                     (long)(iVar27 / local_258) * local_168.cstep * local_88);
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = (int)local_168.elemsize;
          iStack_b4 = local_168.elemsize._4_4_;
          local_b0 = local_168.elempack;
          local_a8 = local_168.allocator;
          local_90 = (int)local_170;
          local_88 = ((long)local_168.d * local_88 * (long)local_168.h * (long)local_168.w + 0xf &
                     0xfffffffffffffff0) / local_88;
          local_a0._0_4_ = local_168.dims;
          local_a0._4_4_ = local_168.w;
          uStack_98._0_4_ = local_168.h;
          uStack_98._4_4_ = local_168.d;
          local_d8 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          local_118 = (void *)((long)(iVar22 / (int)uVar25) * local_1b8.cstep * local_d8 +
                              (long)local_1b8.data);
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = (undefined4)local_1b8.elemsize;
          uStack_104 = local_1b8.elemsize._4_4_;
          local_100 = local_1b8.elempack;
          local_f8 = local_1b8.allocator;
          local_d8 = ((long)local_1b8.d * local_d8 * (long)local_1b8.h * (long)local_1b8.w + 0xf &
                     0xfffffffffffffff0) / local_d8;
          local_f0._0_4_ = local_1b8.dims;
          local_f0._4_4_ = local_1b8.w;
          uStack_e8._0_4_ = local_1b8.h;
          uStack_e8._4_4_ = local_1b8.d;
          pLVar6 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar31];
          local_78._0_1_ = opt->lightmode;
          local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
          local_78._4_4_ = opt->num_threads;
          pAStack_68 = opt->workspace_allocator;
          uStack_60._0_4_ = opt->openmp_blocktime;
          uStack_60._4_1_ = opt->use_winograd_convolution;
          uStack_60._5_1_ = opt->use_sgemm_convolution;
          uStack_60._6_1_ = opt->use_int8_inference;
          uStack_60._7_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          local_58._4_1_ = opt->use_int8_packed;
          local_58._5_1_ = opt->use_int8_storage;
          local_58._6_1_ = opt->use_int8_arithmetic;
          local_58._7_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_50._4_1_ = opt->use_subgroup_shuffle;
          uStack_50._5_1_ = opt->use_image_storage;
          uStack_50._6_1_ = opt->use_tensor_storage;
          uStack_50._7_1_ = opt->use_reserved_0;
          uStack_48._0_4_ = opt->flush_denormals;
          uStack_48._4_1_ = opt->use_local_pool_allocator;
          uStack_48._5_1_ = opt->use_shader_local_memory;
          uStack_48._6_1_ = opt->use_cooperative_matrix;
          uStack_48._7_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_40._4_1_ = opt->use_reserved_8;
          uStack_40._5_1_ = opt->use_reserved_9;
          uStack_40._6_1_ = opt->use_reserved_10;
          uStack_40._7_1_ = opt->use_reserved_11;
          pAStack_70 = local_1b8.allocator;
          local_e0 = (int)uVar24 / (int)uVar25;
          (*pLVar6->_vptr_Layer[7])(pLVar6,&local_c8,&local_118);
          piVar5 = (int *)CONCAT44(uStack_10c,uStack_110);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_f8 == (Allocator *)0x0) {
                if (local_118 != (void *)0x0) {
                  free(local_118);
                }
              }
              else {
                (*local_f8->_vptr_Allocator[3])();
              }
            }
          }
          local_d8 = 0;
          local_118 = (void *)0x0;
          uStack_110 = 0;
          uStack_10c = 0;
          local_108 = 0;
          uStack_104 = 0;
          local_100 = 0;
          local_f0 = 0;
          uStack_e8 = 0;
          local_e0 = 0;
          piVar5 = (int *)CONCAT44(uStack_bc,uStack_c0);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_a8 == (Allocator *)0x0) {
                if (local_c8 != (_func_int ***)0x0) {
                  free(local_c8);
                }
              }
              else {
                (*local_a8->_vptr_Allocator[3])();
              }
            }
          }
          local_88 = 0;
          local_c8 = (_func_int ***)0x0;
          uStack_c0 = 0;
          uStack_bc = 0;
          local_b8 = 0;
          iStack_b4 = 0;
          local_b0 = 0;
          local_a0 = 0;
          uStack_98 = 0;
          local_90 = 0;
          lVar31 = lVar31 + 1;
          iVar22 = iVar22 + uVar24;
          iVar27 = iVar27 + uVar23;
        } while (lVar31 < *(int *)(&this->field_0x108 +
                                  (long)this->_vptr_ConvolutionDepthWise_x86_fma[-3]));
      }
      if (uVar25 < _elempack) {
        convert_packing(&local_1b8,top_blob,_elempack,opt);
        iVar28 = 0;
      }
      else {
        iVar28 = 0;
        if (&local_1b8 != top_blob) {
          piVar5 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar28 = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_1b8.data;
          top_blob->refcount = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
          top_blob->elempack = local_1b8.elempack;
          top_blob->allocator = local_1b8.allocator;
          top_blob->dims = local_1b8.dims;
          top_blob->w = local_1b8.w;
          top_blob->h = local_1b8.h;
          top_blob->d = local_1b8.d;
          top_blob->c = local_1b8.c;
          top_blob->cstep = local_1b8.cstep;
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8._56_8_ = local_1b8._56_8_ & 0xffffffff00000000;
    piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_168.data != (Allocator *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    goto LAB_0040c257;
  }
  if (iVar22 == 1) {
    if (*(int *)(&this->field_0xd4 + (long)p_Var4) != 3) goto LAB_0040b064;
    if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 3) &&
         (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
        (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
       ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
        (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
      convdw3x3s1_sse(&local_208,top_blob,&this->weight_data_tm,
                      (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
    }
    else {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) != 3) ||
           ((*(int *)(&this->field_0xdc + (long)p_Var4) != 1 ||
            (*(int *)(&this->field_0xe0 + (long)p_Var4) != 1)))) ||
          (*(int *)(&this->field_0xe4 + (long)p_Var4) != 2)) ||
         (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)) goto LAB_0040b064;
      convdw3x3s2_sse(&local_208,top_blob,&this->weight_data_tm,
                      (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
    }
LAB_0040be33:
    pLVar6 = this->activation;
    if (pLVar6 != (Layer *)0x0) {
      (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
    }
  }
  else {
    if (iVar22 == 4) {
      iVar22 = *(int *)(&this->field_0xd4 + (long)p_Var4);
      if ((long)iVar22 == 3) {
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 3) &&
             (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
          convdw3x3s1_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
        else {
          if (((iVar22 != 3) ||
              ((*(int *)(&this->field_0xd8 + (long)p_Var4) != 3 ||
               (*(int *)(&this->field_0xdc + (long)p_Var4) != 1)))) ||
             ((*(int *)(&this->field_0xe0 + (long)p_Var4) != 1 ||
              ((*(int *)(&this->field_0xe4 + (long)p_Var4) != 2 ||
               (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)))))) goto LAB_0040afae;
          convdw3x3s2_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
      }
      else {
LAB_0040afae:
        if (iVar22 != 5) {
LAB_0040b740:
          sVar29 = (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * (long)iVar22;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_168,sVar29,
                     (allocator_type *)&local_1b8);
          pp_Var7 = this->_vptr_ConvolutionDepthWise_x86_fma;
          p_Var4 = pp_Var7[-3];
          if (0 < *(int *)(&this->field_0xd8 + (long)p_Var4)) {
            iVar22 = *(int *)(&this->field_0xe0 + (long)p_Var4);
            iVar2 = *(int *)(&this->field_0xdc + (long)p_Var4);
            iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
            iVar26 = 0;
            iVar28 = 0;
            iVar30 = 0;
            do {
              if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var7[-3])) {
                lVar31 = 0;
                do {
                  *(int *)((long)local_168.data + (iVar30 + lVar31) * 4) = iVar28;
                  iVar28 = iVar28 + *(int *)(&this->field_0xdc + (long)pp_Var7[-3]);
                  lVar31 = lVar31 + 1;
                } while ((int)lVar31 < *(int *)(&this->field_0xd4 + (long)pp_Var7[-3]));
                iVar30 = iVar30 + (int)lVar31;
              }
              iVar28 = iVar28 + (iVar21 * iVar22 - iVar2 * iVar3);
              iVar26 = iVar26 + 1;
            } while (iVar26 < *(int *)(&this->field_0xd8 + (long)pp_Var7[-3]));
          }
          if (0 < (int)uVar25) {
            local_11c = (int)sVar29 * 4;
            iVar22 = 0;
            auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar72._8_4_ = 0x3f000000;
            auVar72._0_8_ = 0x3f0000003f000000;
            auVar72._12_4_ = 0x3f000000;
            auVar42 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            local_218 = 0;
            auVar99._8_4_ = 0x3ab743ce;
            auVar99._0_8_ = 0x3ab743ce3ab743ce;
            auVar99._12_4_ = 0x3ab743ce;
            auVar62._8_4_ = 0x3c088908;
            auVar62._0_8_ = 0x3c0889083c088908;
            auVar62._12_4_ = 0x3c088908;
            do {
              if (-1 < iVar27) {
                pvVar34 = (void *)(top_blob->cstep * local_218 * top_blob->elemsize +
                                  (long)top_blob->data);
                pp_Var7 = this->_vptr_ConvolutionDepthWise_x86_fma;
                pvVar8 = (this->weight_data_tm).data;
                iVar2 = 0;
                do {
                  if (-1 < (int)local_170) {
                    uVar33 = 0;
                    do {
                      p_Var4 = pp_Var7[-3];
                      if (*(int *)(&this->field_0x100 + (long)p_Var4) == 0) {
                        auVar76 = ZEXT816(0) << 0x40;
                      }
                      else {
                        auVar76 = *(undefined1 (*) [16])
                                   (*(long *)(&this->field_0x1b0 + (long)p_Var4) + local_218 * 0x10)
                        ;
                      }
                      if (0 < (int)sVar29) {
                        lVar31 = 0;
                        do {
                          auVar76 = vfmadd231ps_fma(auVar76,*(undefined1 (*) [16])
                                                             ((long)pvVar8 +
                                                             lVar31 * 4 + (long)iVar22 * 4),
                                                    *(undefined1 (*) [16])
                                                     ((long)&((Allocator *)
                                                             ((long)local_208.data +
                                                             (long)*(int *)((long)local_168.data +
                                                                           lVar31) * 2 * 8))->
                                                             _vptr_Allocator +
                                                     (long)(*(int *)(&this->field_0xe4 +
                                                                    (long)p_Var4) * (int)uVar33 * 4)
                                                     * 4 + (long)*(int *)(&this->field_0xe8 +
                                                                         (long)p_Var4) * (long)iVar2
                                                           * (long)local_208.w *
                                                             CONCAT44(local_208.elemsize._4_4_,
                                                                      (int)local_208.elemsize) +
                                                           local_208.cstep * local_218 *
                                                           CONCAT44(local_208.elemsize._4_4_,
                                                                    (int)local_208.elemsize)));
                          lVar31 = lVar31 + 4;
                        } while ((sVar29 & 0xffffffff) << 2 != lVar31);
                      }
                      auVar44 = auVar93._0_16_;
                      auVar46 = auVar42._0_16_;
                      fVar9 = auVar42._0_4_;
                      fVar10 = auVar42._4_4_;
                      fVar11 = auVar42._8_4_;
                      fVar12 = auVar42._12_4_;
                      fVar78 = auVar76._4_4_;
                      fVar79 = auVar76._8_4_;
                      fVar80 = auVar76._12_4_;
                      switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var4)) {
                      case 1:
                        auVar76 = vmaxps_avx(auVar76,auVar44);
                        break;
                      case 2:
                        auVar46 = vmaxps_avx(auVar76,auVar44);
                        auVar76 = vminps_avx(auVar76,auVar44);
                        uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var4);
                        auVar77._4_4_ = uVar1;
                        auVar77._0_4_ = uVar1;
                        auVar77._8_4_ = uVar1;
                        auVar77._12_4_ = uVar1;
                        auVar76 = vfmadd213ps_fma(auVar77,auVar76,auVar46);
                        break;
                      case 3:
                        uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var4);
                        auVar46._4_4_ = uVar1;
                        auVar46._0_4_ = uVar1;
                        auVar46._8_4_ = uVar1;
                        auVar46._12_4_ = uVar1;
                        uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var4))[1];
                        auVar103._4_4_ = uVar1;
                        auVar103._0_4_ = uVar1;
                        auVar103._8_4_ = uVar1;
                        auVar103._12_4_ = uVar1;
                        auVar76 = vmaxps_avx(auVar76,auVar46);
                        auVar76 = vminps_avx(auVar103,auVar76);
                        break;
                      case 4:
                        auVar47._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                        auVar47._8_4_ = -fVar79;
                        auVar47._12_4_ = -fVar80;
                        auVar56._8_4_ = 0x42b0c0a5;
                        auVar56._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar56._12_4_ = 0x42b0c0a5;
                        auVar76 = vminps_avx(auVar47,auVar56);
                        auVar57._8_4_ = 0xc2b0c0a5;
                        auVar57._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar57._12_4_ = 0xc2b0c0a5;
                        auVar90 = vmaxps_avx(auVar76,auVar57);
                        auVar74._8_4_ = 0x3fb8aa3b;
                        auVar74._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar74._12_4_ = 0x3fb8aa3b;
                        auVar76 = vfmadd213ps_fma(auVar74,auVar90,auVar72);
                        auVar104._0_4_ = (int)auVar76._0_4_;
                        auVar104._4_4_ = (int)auVar76._4_4_;
                        auVar104._8_4_ = (int)auVar76._8_4_;
                        auVar104._12_4_ = (int)auVar76._12_4_;
                        auVar44 = vcvtdq2ps_avx(auVar104);
                        auVar76 = vcmpps_avx(auVar76,auVar44,1);
                        auVar76 = vandps_avx(auVar76,auVar46);
                        auVar76 = vsubps_avx(auVar44,auVar76);
                        auVar38._8_4_ = 0x3f318000;
                        auVar38._0_8_ = 0x3f3180003f318000;
                        auVar38._12_4_ = 0x3f318000;
                        auVar44 = vfmsub231ps_fma(auVar90,auVar76,auVar38);
                        auVar58._8_4_ = 0x395e8083;
                        auVar58._0_8_ = 0x395e8083395e8083;
                        auVar58._12_4_ = 0x395e8083;
                        auVar90 = vfmsub231ps_fma(auVar44,auVar76,auVar58);
                        auVar105._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                        auVar105._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                        auVar105._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                        auVar105._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                        auVar92._8_4_ = 0x39506967;
                        auVar92._0_8_ = 0x3950696739506967;
                        auVar92._12_4_ = 0x39506967;
                        auVar59._8_4_ = 0x3ab743ce;
                        auVar59._0_8_ = 0x3ab743ce3ab743ce;
                        auVar59._12_4_ = 0x3ab743ce;
                        auVar44 = vfmadd213ps_fma(auVar92,auVar90,auVar59);
                        auVar60._8_4_ = 0x3c088908;
                        auVar60._0_8_ = 0x3c0889083c088908;
                        auVar60._12_4_ = 0x3c088908;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar90,auVar60);
                        auVar39._8_4_ = 0x3d2aa9c1;
                        auVar39._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar39._12_4_ = 0x3d2aa9c1;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar90,auVar39);
                        auVar40._8_4_ = 0x3e2aaaaa;
                        auVar40._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar40._12_4_ = 0x3e2aaaaa;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar90,auVar40);
                        auVar44 = vfmadd213ps_fma(auVar44,auVar90,auVar72);
                        auVar44 = vfmadd213ps_fma(auVar44,auVar105,auVar90);
                        auVar48._0_4_ = auVar44._0_4_ + fVar9;
                        auVar48._4_4_ = auVar44._4_4_ + fVar10;
                        auVar48._8_4_ = auVar44._8_4_ + fVar11;
                        auVar48._12_4_ = auVar44._12_4_ + fVar12;
                        auVar93 = ZEXT864(0) << 0x20;
                        auVar75._0_4_ = (int)auVar76._0_4_;
                        auVar75._4_4_ = (int)auVar76._4_4_;
                        auVar75._8_4_ = (int)auVar76._8_4_;
                        auVar75._12_4_ = (int)auVar76._12_4_;
                        auVar76 = vpslld_avx(auVar75,0x17);
                        auVar76 = vpaddd_avx(auVar76,auVar46);
                        auVar44 = vfmadd213ps_fma(auVar76,auVar48,auVar46);
                        auVar76 = vrcpps_avx(auVar44);
                        auVar46 = vfmsub213ps_fma(auVar44,auVar76,auVar46);
                        auVar76 = vfnmadd132ps_fma(auVar46,auVar76,auVar76);
                        break;
                      case 5:
                        auVar94._8_4_ = 0x42b0c0a5;
                        auVar94._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar94._12_4_ = 0x42b0c0a5;
                        auVar44 = vminps_avx(auVar76,auVar94);
                        auVar96._8_4_ = 0xc2b0c0a5;
                        auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar96._12_4_ = 0xc2b0c0a5;
                        auVar61 = vmaxps_avx(auVar96,auVar44);
                        auVar98._8_4_ = 0x3fb8aa3b;
                        auVar98._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar98._12_4_ = 0x3fb8aa3b;
                        auVar44 = vfmadd213ps_fma(auVar98,auVar61,auVar72);
                        auVar100._0_4_ = (int)auVar44._0_4_;
                        auVar100._4_4_ = (int)auVar44._4_4_;
                        auVar100._8_4_ = (int)auVar44._8_4_;
                        auVar100._12_4_ = (int)auVar44._12_4_;
                        auVar90 = vcvtdq2ps_avx(auVar100);
                        auVar44 = vcmpps_avx(auVar44,auVar90,1);
                        auVar44 = vandps_avx(auVar44,auVar46);
                        auVar44 = vsubps_avx(auVar90,auVar44);
                        auVar95._8_4_ = 0x3f318000;
                        auVar95._0_8_ = 0x3f3180003f318000;
                        auVar95._12_4_ = 0x3f318000;
                        auVar90 = vfmsub231ps_fma(auVar61,auVar44,auVar95);
                        auVar97._8_4_ = 0xb95e8083;
                        auVar97._0_8_ = 0xb95e8083b95e8083;
                        auVar97._12_4_ = 0xb95e8083;
                        auVar61 = vfnmsub231ps_fma(auVar90,auVar44,auVar97);
                        auVar101._0_4_ = auVar61._0_4_ * auVar61._0_4_;
                        auVar101._4_4_ = auVar61._4_4_ * auVar61._4_4_;
                        auVar101._8_4_ = auVar61._8_4_ * auVar61._8_4_;
                        auVar101._12_4_ = auVar61._12_4_ * auVar61._12_4_;
                        auVar73._8_4_ = 0x39506967;
                        auVar73._0_8_ = 0x3950696739506967;
                        auVar73._12_4_ = 0x39506967;
                        auVar90 = vfmadd213ps_fma(auVar73,auVar61,auVar99);
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar62);
                        auVar71._8_4_ = 0x3d2aa9c1;
                        auVar71._0_8_ = 0x3d2aa9c13d2aa9c1;
                        auVar71._12_4_ = 0x3d2aa9c1;
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar71);
                        auVar63._8_4_ = 0x3e2aaaaa;
                        auVar63._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar63._12_4_ = 0x3e2aaaaa;
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar63);
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar72);
                        auVar90 = vfmadd213ps_fma(auVar90,auVar101,auVar61);
                        auVar49._0_4_ = auVar90._0_4_ + fVar9;
                        auVar49._4_4_ = auVar90._4_4_ + fVar10;
                        auVar49._8_4_ = auVar90._8_4_ + fVar11;
                        auVar49._12_4_ = auVar90._12_4_ + fVar12;
                        auVar43._0_4_ = (int)auVar44._0_4_;
                        auVar43._4_4_ = (int)auVar44._4_4_;
                        auVar43._8_4_ = (int)auVar44._8_4_;
                        auVar43._12_4_ = (int)auVar44._12_4_;
                        auVar44 = vpslld_avx(auVar43,0x17);
                        auVar44 = vpaddd_avx(auVar44,auVar46);
                        auVar37 = vfmadd213ps_fma(auVar44,auVar49,auVar46);
                        auVar50._8_4_ = 0x800000;
                        auVar50._0_8_ = 0x80000000800000;
                        auVar50._12_4_ = 0x800000;
                        auVar44 = vmaxps_avx(auVar37,auVar50);
                        auVar90 = vpsrld_avx(auVar44,0x17);
                        auVar64._8_4_ = 0xffffff82;
                        auVar64._0_8_ = 0xffffff82ffffff82;
                        auVar64._12_4_ = 0xffffff82;
                        auVar90 = vpaddd_avx(auVar90,auVar64);
                        auVar65._8_4_ = 0x807fffff;
                        auVar65._0_8_ = 0x807fffff807fffff;
                        auVar65._12_4_ = 0x807fffff;
                        auVar44 = vandps_avx(auVar44,auVar65);
                        auVar36 = vorps_avx(auVar44,auVar72);
                        auVar61 = vcvtdq2ps_avx(auVar90);
                        auVar66._8_4_ = 0x3f3504f3;
                        auVar66._0_8_ = 0x3f3504f33f3504f3;
                        auVar66._12_4_ = 0x3f3504f3;
                        auVar90 = vcmpps_avx(auVar36,auVar66,1);
                        auVar44 = vandps_avx(auVar90,auVar36);
                        auVar51._0_4_ = auVar36._0_4_ + -1.0 + auVar44._0_4_;
                        auVar51._4_4_ = auVar36._4_4_ + -1.0 + auVar44._4_4_;
                        auVar51._8_4_ = auVar36._8_4_ + -1.0 + auVar44._8_4_;
                        auVar51._12_4_ = auVar36._12_4_ + -1.0 + auVar44._12_4_;
                        auVar44 = vandps_avx(auVar90,auVar46);
                        auVar90 = vsubps_avx(auVar61,auVar44);
                        auVar91._0_4_ = auVar51._0_4_ * auVar51._0_4_;
                        auVar91._4_4_ = auVar51._4_4_ * auVar51._4_4_;
                        auVar91._8_4_ = auVar51._8_4_ * auVar51._8_4_;
                        auVar91._12_4_ = auVar51._12_4_ * auVar51._12_4_;
                        auVar102._8_4_ = 0x3d9021bb;
                        auVar102._0_8_ = 0x3d9021bb3d9021bb;
                        auVar102._12_4_ = 0x3d9021bb;
                        auVar81._8_4_ = 0xbdebd1b8;
                        auVar81._0_8_ = 0xbdebd1b8bdebd1b8;
                        auVar81._12_4_ = 0xbdebd1b8;
                        auVar44 = vfmadd213ps_fma(auVar102,auVar51,auVar81);
                        auVar82._8_4_ = 0x3def251a;
                        auVar82._0_8_ = 0x3def251a3def251a;
                        auVar82._12_4_ = 0x3def251a;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar51,auVar82);
                        auVar83._8_4_ = 0xbdfe5d4f;
                        auVar83._0_8_ = 0xbdfe5d4fbdfe5d4f;
                        auVar83._12_4_ = 0xbdfe5d4f;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar51,auVar83);
                        auVar84._8_4_ = 0x3e11e9bf;
                        auVar84._0_8_ = 0x3e11e9bf3e11e9bf;
                        auVar84._12_4_ = 0x3e11e9bf;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar51,auVar84);
                        auVar85._8_4_ = 0xbe2aae50;
                        auVar85._0_8_ = 0xbe2aae50be2aae50;
                        auVar85._12_4_ = 0xbe2aae50;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar51,auVar85);
                        auVar86._8_4_ = 0x3e4cceac;
                        auVar86._0_8_ = 0x3e4cceac3e4cceac;
                        auVar86._12_4_ = 0x3e4cceac;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar51,auVar86);
                        auVar87._8_4_ = 0xbe7ffffc;
                        auVar87._0_8_ = 0xbe7ffffcbe7ffffc;
                        auVar87._12_4_ = 0xbe7ffffc;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar51,auVar87);
                        auVar88._8_4_ = 0x3eaaaaaa;
                        auVar88._0_8_ = 0x3eaaaaaa3eaaaaaa;
                        auVar88._12_4_ = 0x3eaaaaaa;
                        auVar44 = vfmadd213ps_fma(auVar44,auVar51,auVar88);
                        auVar89._0_4_ = auVar91._0_4_ * auVar51._0_4_ * auVar44._0_4_;
                        auVar89._4_4_ = auVar91._4_4_ * auVar51._4_4_ * auVar44._4_4_;
                        auVar89._8_4_ = auVar91._8_4_ * auVar51._8_4_ * auVar44._8_4_;
                        auVar89._12_4_ = auVar91._12_4_ * auVar51._12_4_ * auVar44._12_4_;
                        auVar44 = vfmadd231ps_fma(auVar89,auVar90,auVar97);
                        auVar61 = vfmsub231ps_fma(auVar44,auVar72,auVar91);
                        auVar44._12_4_ = 0;
                        auVar44._0_12_ = ZEXT412(0);
                        auVar93 = ZEXT1264(ZEXT412(0)) << 0x20;
                        auVar44 = vcmpps_avx(auVar37,auVar44 << 0x20,2);
                        auVar61 = vsubps_avx(auVar61,auVar51);
                        auVar90 = vfnmadd231ps_fma(auVar61,auVar95,auVar90);
                        auVar52._0_4_ = auVar90._0_4_ + auVar90._0_4_;
                        auVar52._4_4_ = auVar90._4_4_ + auVar90._4_4_;
                        auVar52._8_4_ = auVar90._8_4_ + auVar90._8_4_;
                        auVar52._12_4_ = auVar90._12_4_ + auVar90._12_4_;
                        auVar67._8_4_ = 0x7fffffff;
                        auVar67._0_8_ = 0x7fffffff7fffffff;
                        auVar67._12_4_ = 0x7fffffff;
                        auVar44 = vblendvps_avx(auVar52,auVar67,auVar44);
                        auVar53._8_4_ = 0x42b0c0a5;
                        auVar53._0_8_ = 0x42b0c0a542b0c0a5;
                        auVar53._12_4_ = 0x42b0c0a5;
                        auVar44 = vminps_avx(auVar44,auVar53);
                        auVar54._8_4_ = 0xc2b0c0a5;
                        auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
                        auVar54._12_4_ = 0xc2b0c0a5;
                        auVar61 = vmaxps_avx(auVar44,auVar54);
                        auVar44 = vfmadd213ps_fma(auVar98,auVar61,auVar72);
                        auVar68._0_4_ = (int)auVar44._0_4_;
                        auVar68._4_4_ = (int)auVar44._4_4_;
                        auVar68._8_4_ = (int)auVar44._8_4_;
                        auVar68._12_4_ = (int)auVar44._12_4_;
                        auVar90 = vcvtdq2ps_avx(auVar68);
                        auVar44 = vcmpps_avx(auVar44,auVar90,1);
                        auVar44 = vandps_avx(auVar44,auVar46);
                        auVar44 = vsubps_avx(auVar90,auVar44);
                        auVar90 = vfmsub231ps_fma(auVar61,auVar44,auVar95);
                        auVar61 = vfnmsub231ps_fma(auVar90,auVar44,auVar97);
                        auVar69._0_4_ = auVar61._0_4_ * auVar61._0_4_;
                        auVar69._4_4_ = auVar61._4_4_ * auVar61._4_4_;
                        auVar69._8_4_ = auVar61._8_4_ * auVar61._8_4_;
                        auVar69._12_4_ = auVar61._12_4_ * auVar61._12_4_;
                        auVar90 = vfmadd213ps_fma(auVar73,auVar61,auVar99);
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar62);
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar71);
                        auVar42 = ZEXT1664(auVar46);
                        auVar36._8_4_ = 0x3e2aaaaa;
                        auVar36._0_8_ = 0x3e2aaaaa3e2aaaaa;
                        auVar36._12_4_ = 0x3e2aaaaa;
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar36);
                        auVar90 = vfmadd213ps_fma(auVar90,auVar61,auVar72);
                        auVar90 = vfmadd213ps_fma(auVar90,auVar69,auVar61);
                        auVar45._0_4_ = auVar90._0_4_ + fVar9;
                        auVar45._4_4_ = auVar90._4_4_ + fVar10;
                        auVar45._8_4_ = auVar90._8_4_ + fVar11;
                        auVar45._12_4_ = auVar90._12_4_ + fVar12;
                        auVar55._0_4_ = (int)auVar44._0_4_;
                        auVar55._4_4_ = (int)auVar44._4_4_;
                        auVar55._8_4_ = (int)auVar44._8_4_;
                        auVar55._12_4_ = (int)auVar44._12_4_;
                        auVar44 = vpslld_avx(auVar55,0x17);
                        auVar44 = vpaddd_avx(auVar44,auVar46);
                        auVar44 = vfmadd213ps_fma(auVar44,auVar45,auVar46);
                        auVar46 = vrcpps_avx(auVar44);
                        auVar70._0_4_ = auVar46._0_4_ + auVar46._0_4_;
                        auVar70._4_4_ = auVar46._4_4_ + auVar46._4_4_;
                        auVar70._8_4_ = auVar46._8_4_ + auVar46._8_4_;
                        auVar70._12_4_ = auVar46._12_4_ + auVar46._12_4_;
                        auVar37._8_4_ = 0x40000000;
                        auVar37._0_8_ = 0x4000000040000000;
                        auVar37._12_4_ = 0x40000000;
                        auVar44 = vfmsub213ps_fma(auVar44,auVar70,auVar37);
                        auVar46 = vfnmadd213ps_fma(auVar44,auVar46,auVar70);
                        auVar76 = vfmsub231ps_fma(auVar76,auVar76,auVar46);
                        break;
                      case 6:
                        uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var4);
                        auVar90._4_4_ = uVar1;
                        auVar90._0_4_ = uVar1;
                        auVar90._8_4_ = uVar1;
                        auVar90._12_4_ = uVar1;
                        uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var4))[1];
                        auVar61._4_4_ = uVar1;
                        auVar61._0_4_ = uVar1;
                        auVar61._8_4_ = uVar1;
                        auVar61._12_4_ = uVar1;
                        auVar90 = vfmadd231ps_fma(auVar61,auVar76,auVar90);
                        auVar44 = vmaxps_avx(auVar44,auVar90);
                        auVar46 = vminps_avx(auVar44,auVar46);
                        auVar76._0_4_ = auVar76._0_4_ * auVar46._0_4_;
                        auVar76._4_4_ = fVar78 * auVar46._4_4_;
                        auVar76._8_4_ = fVar79 * auVar46._8_4_;
                        auVar76._12_4_ = fVar80 * auVar46._12_4_;
                      }
                      *(undefined1 (*) [16])((long)pvVar34 + uVar33 * 0x10) = auVar76;
                      uVar33 = uVar33 + 1;
                    } while (uVar33 != _w);
                  }
                  pvVar34 = (void *)((long)pvVar34 + (long)(int)(_w * 4) * 4);
                  bVar35 = iVar2 != iVar27;
                  iVar2 = iVar2 + 1;
                } while (bVar35);
              }
              local_218 = local_218 + 1;
              iVar22 = iVar22 + local_11c;
            } while (local_218 != uVar25);
          }
          if (local_168.data != (void *)0x0) {
            operator_delete(local_168.data,
                            CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize) -
                            (long)local_168.data);
          }
          iVar28 = 0;
          goto LAB_0040c257;
        }
        if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 5) &&
             (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
          convdw5x5s1_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
        else {
          if (((*(int *)(&this->field_0xd8 + (long)p_Var4) != 5) ||
              ((*(int *)(&this->field_0xdc + (long)p_Var4) != 1 ||
               (*(int *)(&this->field_0xe0 + (long)p_Var4) != 1)))) ||
             ((*(int *)(&this->field_0xe4 + (long)p_Var4) != 2 ||
              (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)))) goto LAB_0040b740;
          convdw5x5s2_pack4_sse
                    (&local_208,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
        }
      }
      goto LAB_0040be33;
    }
    if (iVar22 != 8) goto LAB_0040b064;
    iVar22 = *(int *)(&this->field_0xd4 + (long)p_Var4);
    if ((long)iVar22 == 3) {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 3) &&
           (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
        convdw3x3s1_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
      }
      else {
        if ((((iVar22 != 3) ||
             ((*(int *)(&this->field_0xd8 + (long)p_Var4) != 3 ||
              (*(int *)(&this->field_0xdc + (long)p_Var4) != 1)))) ||
            (*(int *)(&this->field_0xe0 + (long)p_Var4) != 1)) ||
           ((*(int *)(&this->field_0xe4 + (long)p_Var4) != 2 ||
            (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)))) goto LAB_0040b68a;
        convdw3x3s2_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
      }
      goto LAB_0040be33;
    }
LAB_0040b68a:
    if (iVar22 == 5) {
      if ((((*(int *)(&this->field_0xd8 + (long)p_Var4) == 5) &&
           (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
        convdw5x5s1_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
      }
      else {
        if (((*(int *)(&this->field_0xd8 + (long)p_Var4) != 5) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var4) != 1 ||
             (*(int *)(&this->field_0xe0 + (long)p_Var4) != 1)))) ||
           ((*(int *)(&this->field_0xe4 + (long)p_Var4) != 2 ||
            (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)))) goto LAB_0040be53;
        convdw5x5s2_pack8_avx
                  (&local_208,top_blob,&this->weight_data_tm,
                   (Mat *)(&this->field_0x1b0 + (long)p_Var4),opt_00);
      }
      goto LAB_0040be33;
    }
LAB_0040be53:
    sVar29 = (long)*(int *)(&this->field_0xd8 + (long)p_Var4) * (long)iVar22;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_168,sVar29,(allocator_type *)&local_1b8);
    pp_Var7 = this->_vptr_ConvolutionDepthWise_x86_fma;
    p_Var4 = pp_Var7[-3];
    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var4)) {
      iVar22 = *(int *)(&this->field_0xe0 + (long)p_Var4);
      iVar2 = *(int *)(&this->field_0xdc + (long)p_Var4);
      iVar3 = *(int *)(&this->field_0xd4 + (long)p_Var4);
      iVar26 = 0;
      iVar28 = 0;
      iVar30 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var7[-3])) {
          lVar31 = 0;
          do {
            *(int *)((long)local_168.data + (iVar26 + lVar31) * 4) = iVar28;
            iVar28 = iVar28 + *(int *)(&this->field_0xdc + (long)pp_Var7[-3]);
            lVar31 = lVar31 + 1;
          } while ((int)lVar31 < *(int *)(&this->field_0xd4 + (long)pp_Var7[-3]));
          iVar26 = iVar26 + (int)lVar31;
        }
        iVar28 = iVar28 + (iVar21 * iVar22 - iVar2 * iVar3);
        iVar30 = iVar30 + 1;
      } while (iVar30 < *(int *)(&this->field_0xd8 + (long)pp_Var7[-3]));
    }
    if (0 < (int)uVar25) {
      iVar22 = 0;
      local_240 = 0;
      do {
        if (-1 < iVar27) {
          pvVar34 = (void *)(top_blob->cstep * local_240 * top_blob->elemsize + (long)top_blob->data
                            );
          pp_Var7 = this->_vptr_ConvolutionDepthWise_x86_fma;
          pvVar8 = (this->weight_data_tm).data;
          iVar2 = 0;
          do {
            if (-1 < (int)local_170) {
              uVar33 = 0;
              do {
                p_Var4 = pp_Var7[-3];
                if (*(int *)(&this->field_0x100 + (long)p_Var4) == 0) {
                  auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar42 = ZEXT3264(*(undefined1 (*) [32])
                                      (*(long *)(&this->field_0x1b0 + (long)p_Var4) +
                                      local_240 * 0x20));
                }
                auVar41 = auVar42._0_32_;
                if (0 < (int)sVar29) {
                  lVar31 = 0;
                  do {
                    auVar62 = vfmadd231ps_fma(auVar42._0_32_,
                                              *(undefined1 (*) [32])
                                               ((long)&((Allocator *)
                                                       ((long)local_208.data +
                                                       (long)*(int *)((long)local_168.data + lVar31)
                                                       * 4 * 8))->_vptr_Allocator +
                                               (long)(*(int *)(&this->field_0xe4 + (long)p_Var4) *
                                                      (int)uVar33 * 8) * 4 +
                                               (long)*(int *)(&this->field_0xe8 + (long)p_Var4) *
                                               (long)iVar2 *
                                               (long)local_208.w *
                                               CONCAT44(local_208.elemsize._4_4_,
                                                        (int)local_208.elemsize) +
                                               local_208.cstep * local_240 *
                                               CONCAT44(local_208.elemsize._4_4_,
                                                        (int)local_208.elemsize)),
                                              *(undefined1 (*) [32])
                                               ((long)pvVar8 + lVar31 * 8 + (long)iVar22 * 4));
                    auVar42 = ZEXT1664(auVar62);
                    auVar41 = ZEXT1632(auVar62);
                    lVar31 = lVar31 + 4;
                  } while ((sVar29 & 0xffffffff) << 2 != lVar31);
                }
                *(undefined1 (*) [32])((long)pvVar34 + uVar33 * 0x20) = auVar41;
                uVar33 = uVar33 + 1;
              } while (uVar33 != _w);
            }
            pvVar34 = (void *)((long)pvVar34 + (long)(int)(_w * 8) * 4);
            bVar35 = iVar2 != iVar27;
            iVar2 = iVar2 + 1;
          } while (bVar35);
        }
        local_240 = local_240 + 1;
        iVar22 = iVar22 + (int)sVar29 * 8;
      } while (local_240 != uVar25);
    }
    pLVar6 = this->activation;
    if (pLVar6 != (Layer *)0x0) {
      (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
    }
    if (local_168.data != (void *)0x0) {
      operator_delete(local_168.data,
                      CONCAT44(local_168.elemsize._4_4_,(int)local_168.elemsize) -
                      (long)local_168.data);
    }
  }
  iVar28 = 0;
LAB_0040c257:
  piVar5 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_208.data != (Allocator *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}